

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadContactSurfaceMesh::LoadGetStateBlock_w
          (ChLoadContactSurfaceMesh *this,ChStateDelta *mD)

{
  pointer psVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  lVar3 = 0;
  iVar4 = 0;
  for (uVar5 = 0;
      psVar1 = (this->forces).
               super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->forces).
                            super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar5 = uVar5 + 1) {
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableUVW,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(psVar1->
                                 super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar3) + 0x58));
    (**(code **)(*local_40 + 0x28))(local_40,iVar4,mD);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChLoadableUVW,void>
              ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)&(((this->forces).
                                   super__Vector_base<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chrono::ChLoadXYZnode,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr + lVar3) + 0x58));
    iVar2 = (**(code **)(*local_40 + 0x18))();
    iVar4 = iVar4 + iVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void ChLoadContactSurfaceMesh::LoadGetStateBlock_w(ChStateDelta& mD) {
    int ndoftot = 0;
    for (int i = 0; i < forces.size(); ++i) {
        forces[i]->loader.GetLoadable()->LoadableGetStateBlock_w(ndoftot, mD);
        ndoftot += forces[i]->loader.GetLoadable()->LoadableGet_ndof_w();
    }
}